

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

vector<duckdb::DataPointer,_true> * __thiscall
duckdb::ColumnData::GetDataPointers
          (vector<duckdb::DataPointer,_true> *__return_storage_ptr__,ColumnData *this)

{
  __pointer_type this_00;
  DataPointer DStack_a8;
  
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>).
  super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                      (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  if (this_00 != (ColumnSegment *)0x0) {
    do {
      ColumnSegment::GetDataPointer(&DStack_a8,this_00);
      ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::
      emplace_back<duckdb::DataPointer>
                (&__return_storage_ptr__->
                  super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>,&DStack_a8
                );
      if (DStack_a8.segment_state.
          super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
          .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true,_true>
           )0x0) {
        (*(*(_func_int ***)
            DStack_a8.segment_state.
            super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
            .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl)[1])();
      }
      DStack_a8.segment_state.
      super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
      .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
           )(__uniq_ptr_data<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true,_true>
             )0x0;
      BaseStatistics::~BaseStatistics(&DStack_a8.statistics);
      this_00 = (this_00->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
    } while (this_00 != (__pointer_type)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<DataPointer> ColumnData::GetDataPointers() {
	vector<DataPointer> pointers;
	for (auto &segment : data.Segments()) {
		pointers.push_back(segment.GetDataPointer());
	}
	return pointers;
}